

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::Expect(AsciiParser *this,char expect_c)

{
  bool bVar1;
  ostream *poVar2;
  string local_288;
  ostringstream local_268 [8];
  ostringstream ss_e;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string msg;
  bool ret;
  char c;
  char expect_c_local;
  AsciiParser *this_local;
  
  msg.field_2._M_local_buf[0xf] = expect_c;
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    bVar1 = Char1(this,msg.field_2._M_local_buf + 0xe);
    if (bVar1) {
      msg.field_2._M_local_buf[0xd] = msg.field_2._M_local_buf[0xe] == msg.field_2._M_local_buf[0xf]
      ;
      if ((bool)msg.field_2._M_local_buf[0xd]) {
        (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
        this_local._7_1_ = (bool)msg.field_2._M_local_buf[0xd];
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_c0,msg.field_2._M_local_buf + 0xf,1,&local_c1);
        ::std::operator+((char *)local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Expected `");
        ::std::operator+(local_80,(char *)local_a0);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_e8,msg.field_2._M_local_buf + 0xe,1,&local_e9);
        ::std::operator+(local_60,local_80);
        ::std::operator+(local_40,(char *)local_60);
        ::std::__cxx11::string::~string((string *)local_60);
        ::std::__cxx11::string::~string(local_e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        ::std::__cxx11::string::~string((string *)local_80);
        ::std::__cxx11::string::~string(local_a0);
        ::std::__cxx11::string::~string(local_c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        ::std::__cxx11::ostringstream::ostringstream(local_268);
        poVar2 = ::std::operator<<((ostream *)local_268,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"Expect");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x8f6);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_268,(string *)local_40);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_288);
        ::std::__cxx11::string::~string((string *)&local_288);
        this_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_268);
        ::std::__cxx11::string::~string((string *)local_40);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::Expect(char expect_c) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    // this should not happen.
    return false;
  }

  bool ret = (c == expect_c);

  if (!ret) {
    std::string msg = "Expected `" + std::string(&expect_c, 1) + "` but got `" +
                      std::string(&c, 1) + "`\n";
    PUSH_ERROR_AND_RETURN(msg);

    // unwind
    _sr->seek_from_current(-1);
  } else {
    _curr_cursor.col++;
  }

  return ret;
}